

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  Vdbe *p;
  int addr;
  char *pcVar1;
  char *pcVar2;
  
  if (pParse->explain != '\x02') {
    return;
  }
  pcVar2 = "";
  pcVar1 = "USING COVERING INDEX ";
  if (pIdx == (Index *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar2 = pIdx->zName;
  }
  pcVar2 = sqlite3MPrintf(pParse->db,"SCAN TABLE %s %s%s(~%d rows)",pTab->zName,pcVar1,pcVar2,
                          (ulong)pTab->nRowEst);
  p = pParse->pVdbe;
  addr = sqlite3VdbeAddOp3(p,0x96,pParse->iSelectId,0,0);
  sqlite3VdbeChangeP4(p,addr,pcVar2,-1);
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    char *zEqp = sqlite3MPrintf(pParse->db, "SCAN TABLE %s %s%s(~%d rows)",
        pTab->zName, 
        pIdx ? "USING COVERING INDEX " : "",
        pIdx ? pIdx->zName : "",
        pTab->nRowEst
    );
    sqlite3VdbeAddOp4(
        pParse->pVdbe, OP_Explain, pParse->iSelectId, 0, 0, zEqp, P4_DYNAMIC
    );
  }
}